

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qudpsocket.cpp
# Opt level: O2

QNetworkDatagram __thiscall QUdpSocket::receiveDatagram(QUdpSocket *this,qint64 maxSize)

{
  QAbstractSocketPrivate *this_00;
  QAbstractSocketEngine *pQVar1;
  bool bVar2;
  SocketError errorCode;
  char *pcVar3;
  long lVar4;
  long in_RDX;
  long in_FS_OFFSET;
  QHostAddress local_60;
  QArrayDataPointer<char16_t> local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSocketPrivate **)(maxSize + 8);
  bVar2 = QAbstractSocket::isValid((QAbstractSocket *)maxSize);
  if (bVar2) {
    if ((in_RDX < 0) &&
       (in_RDX = (**(code **)(*(long *)this_00->socketEngine + 0xf0))(), in_RDX < 0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QNetworkDatagram::QNetworkDatagram((QNetworkDatagram *)this);
        return (QNetworkDatagram)(QNetworkDatagramPrivate *)this;
      }
      goto LAB_001bc349;
    }
    *(undefined1 **)&this->super_QAbstractSocket = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)&local_58,in_RDX,Uninitialized);
    QHostAddress::QHostAddress(&local_60);
    QNetworkDatagram::QNetworkDatagram((QNetworkDatagram *)this,(QByteArray *)&local_58,&local_60,0)
    ;
    QHostAddress::~QHostAddress(&local_60);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
    pQVar1 = this_00->socketEngine;
    pcVar3 = QByteArray::data(*(QByteArray **)&this->super_QAbstractSocket);
    lVar4 = (**(code **)(*(long *)pQVar1 + 0xf8))
                      (pQVar1,pcVar3,in_RDX,*(long *)&this->super_QAbstractSocket + 0x18,0xff);
    this_00->hasPendingData = false;
    this_00->hasPendingDatagram = false;
    (**(code **)(*(long *)this_00->socketEngine + 0x140))(this_00->socketEngine,1);
    if (lVar4 < 0) {
      errorCode = QAbstractSocketEngine::error((QAbstractSocketEngine *)this_00->socketEngine);
      QAbstractSocketEngine::errorString
                ((QString *)&local_58,(QAbstractSocketEngine *)this_00->socketEngine);
      QAbstractSocketPrivate::setErrorAndEmit(this_00,errorCode,(QString *)&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    }
    QByteArray::truncate(*(longlong *)&this->super_QAbstractSocket);
  }
  else {
    local_58.d._0_4_ = 2;
    local_58.size._4_4_ = 0;
    local_58._4_8_ = 0;
    local_58._12_8_ = 0;
    local_40 = "default";
    QMessageLogger::warning
              ((char *)&local_58,
               "QUdpSocket::receiveDatagram() called on a QUdpSocket when not in QUdpSocket::BoundState"
              );
    QNetworkDatagram::QNetworkDatagram((QNetworkDatagram *)this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QNetworkDatagram)(QNetworkDatagramPrivate *)this;
  }
LAB_001bc349:
  __stack_chk_fail();
}

Assistant:

QNetworkDatagram QUdpSocket::receiveDatagram(qint64 maxSize)
{
    Q_D(QUdpSocket);

#if defined QUDPSOCKET_DEBUG
    qDebug("QUdpSocket::receiveDatagram(%lld)", maxSize);
#endif
    QT_CHECK_BOUND("QUdpSocket::receiveDatagram()", QNetworkDatagram());

    if (maxSize < 0)
        maxSize = d->socketEngine->pendingDatagramSize();
    if (maxSize < 0)
        return QNetworkDatagram();

    QNetworkDatagram result(QByteArray(maxSize, Qt::Uninitialized));
    qint64 readBytes = d->socketEngine->readDatagram(result.d->data.data(), maxSize, &result.d->header,
                                                     QAbstractSocketEngine::WantAll);
    d->hasPendingData = false;
    d->hasPendingDatagram = false;
    d->socketEngine->setReadNotificationEnabled(true);
    if (readBytes < 0) {
        d->setErrorAndEmit(d->socketEngine->error(), d->socketEngine->errorString());
        readBytes = 0;
    }

    result.d->data.truncate(readBytes);
    return result;
}